

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scrubbers.cpp
# Opt level: O0

Scrubber *
ApprovalTests::Scrubbers::createRegexScrubber(string *regexString,string *replacementText)

{
  ulong uVar1;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_RDI;
  string *unaff_retaddr;
  regex *in_stack_00000008;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> *this;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_00;
  flag_type in_stack_ffffffffffffffd4;
  element_type *in_stack_ffffffffffffffd8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffe0;
  
  this_00 = in_RDI;
  uVar1 = ::std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    this = (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&stack0xffffffffffffffc8;
    ::std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
               in_stack_ffffffffffffffe0._M_pi,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    createRegexScrubber(in_stack_00000008,unaff_retaddr);
    ::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(this);
  }
  else {
    ::std::function<std::__cxx11::string(std::__cxx11::string_const&)>::
    function<std::__cxx11::string(&)(std::__cxx11::string_const&),void>
              (this_00,(_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                        *)in_RDI);
  }
  return this_00;
}

Assistant:

Scrubber createRegexScrubber(const std::string& regexString,
                                     const std::string& replacementText)
        {
            if (regexString.empty())
            {
                return doNothing;
            }
            return createRegexScrubber(std::regex(regexString), replacementText);
        }